

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

SQFunctionProto * __thiscall SQFuncState::BuildProto(SQFuncState *this)

{
  size_type sVar1;
  SQOuterVar *x;
  SQOuterVar *this_00;
  SQFunctionProto *pSVar2;
  SQInteger SVar3;
  SQLineInfo *pSVar4;
  long *plVar5;
  SQInstruction *__src;
  SQObjectPtr *obj;
  long in_RDI;
  SQObjectPtr *this_01;
  SQUnsignedInteger nd;
  SQUnsignedInteger ni;
  SQUnsignedInteger nl;
  SQUnsignedInteger no;
  SQUnsignedInteger np;
  SQUnsignedInteger nf;
  SQInteger idx;
  SQObjectPtr val;
  SQObjectPtr key;
  SQObjectPtr refidx;
  SQFunctionProto *f;
  SQObjectPtr *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  SQObjectPtr *in_stack_fffffffffffffe78;
  SQInstruction *__dest;
  SQInteger in_stack_fffffffffffffe80;
  SQTable *in_stack_fffffffffffffe88;
  SQInteger in_stack_fffffffffffffe90;
  ulong uVar6;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  SQSharedState *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  SQInteger in_stack_fffffffffffffeb8;
  SQInteger in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  
  sqvector<SQInstruction,_unsigned_int>::size
            ((sqvector<SQInstruction,_unsigned_int> *)(in_RDI + 200));
  sqvector<SQObjectPtr,_unsigned_int>::size((sqvector<SQObjectPtr,_unsigned_int> *)(in_RDI + 0x98));
  sqvector<SQObjectPtr,_unsigned_int>::size((sqvector<SQObjectPtr,_unsigned_int> *)(in_RDI + 0x80));
  sVar1 = sqvector<SQOuterVar,_unsigned_int>::size
                    ((sqvector<SQOuterVar,_unsigned_int> *)(in_RDI + 0xb0));
  x = (SQOuterVar *)(ulong)sVar1;
  sVar1 = sqvector<SQLineInfo,_unsigned_int>::size
                    ((sqvector<SQLineInfo,_unsigned_int> *)(in_RDI + 0x140));
  this_00 = (SQOuterVar *)(ulong)sVar1;
  sVar1 = sqvector<SQLocalVarInfo,_unsigned_int>::size
                    ((sqvector<SQLocalVarInfo,_unsigned_int> *)(in_RDI + 0xe0));
  obj = (SQObjectPtr *)(ulong)sVar1;
  sVar1 = sqvector<long,_unsigned_int>::size((sqvector<long,_unsigned_int> *)(in_RDI + 0x1a8));
  this_01 = (SQObjectPtr *)(ulong)sVar1;
  pSVar2 = SQFunctionProto::Create
                     (in_stack_fffffffffffffea0,
                      CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                      in_stack_fffffffffffffe90,(SQInteger)in_stack_fffffffffffffe88,
                      in_stack_fffffffffffffe80,(SQInteger)in_stack_fffffffffffffe78,
                      CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                      in_stack_fffffffffffffeb8,in_stack_fffffffffffffec0,
                      CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)this_00);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)this_00);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)this_00);
  pSVar2->_stacksize = *(SQInteger *)(in_RDI + 0x40);
  ::SQObjectPtr::operator=(this_01,obj);
  pSVar2->_bgenerator = (bool)(*(byte *)(in_RDI + 0x49) & 1);
  ::SQObjectPtr::operator=(this_01,obj);
  pSVar2->_hoistingLevel = *(SQInteger *)(in_RDI + 0x1d8);
  while( true ) {
    SVar3 = SQTable::Next(in_stack_fffffffffffffe88,
                          SUB81((ulong)in_stack_fffffffffffffe80 >> 0x38,0),
                          in_stack_fffffffffffffe78,
                          (SQObjectPtr *)
                          CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                          in_stack_fffffffffffffe68);
    if (SVar3 == -1) break;
    ::SQObjectPtr::operator=(this_01,obj);
    ::SQObjectPtr::operator=((SQObjectPtr *)this_00,(SQInteger)x);
  }
  local_70 = 0;
  while( true ) {
    sVar1 = sqvector<SQObjectPtr,_unsigned_int>::size
                      ((sqvector<SQObjectPtr,_unsigned_int> *)(in_RDI + 0x80));
    if (sVar1 <= local_70) break;
    sqvector<SQObjectPtr,_unsigned_int>::operator[]
              ((sqvector<SQObjectPtr,_unsigned_int> *)(in_RDI + 0x80),(size_type)local_70);
    ::SQObjectPtr::operator=(this_01,obj);
    local_70 = local_70 + 1;
  }
  local_78 = 0;
  while( true ) {
    sVar1 = sqvector<SQObjectPtr,_unsigned_int>::size
                      ((sqvector<SQObjectPtr,_unsigned_int> *)(in_RDI + 0x98));
    if (sVar1 <= local_78) break;
    sqvector<SQObjectPtr,_unsigned_int>::operator[]
              ((sqvector<SQObjectPtr,_unsigned_int> *)(in_RDI + 0x98),(size_type)local_78);
    ::SQObjectPtr::operator=(this_01,obj);
    local_78 = local_78 + 1;
  }
  local_80 = 0;
  while( true ) {
    sVar1 = sqvector<SQOuterVar,_unsigned_int>::size
                      ((sqvector<SQOuterVar,_unsigned_int> *)(in_RDI + 0xb0));
    if (sVar1 <= local_80) break;
    sqvector<SQOuterVar,_unsigned_int>::operator[]
              ((sqvector<SQOuterVar,_unsigned_int> *)(in_RDI + 0xb0),(size_type)local_80);
    SQOuterVar::operator=(this_00,x);
    local_80 = local_80 + 1;
  }
  local_88 = 0;
  while( true ) {
    uVar6 = local_88;
    sVar1 = sqvector<SQLocalVarInfo,_unsigned_int>::size
                      ((sqvector<SQLocalVarInfo,_unsigned_int> *)(in_RDI + 0xe0));
    if (sVar1 <= uVar6) break;
    sqvector<SQLocalVarInfo,_unsigned_int>::operator[]
              ((sqvector<SQLocalVarInfo,_unsigned_int> *)(in_RDI + 0xe0),(size_type)local_88);
    SQLocalVarInfo::operator=((SQLocalVarInfo *)this_00,(SQLocalVarInfo *)x);
    local_88 = local_88 + 1;
  }
  local_90 = 0;
  while( true ) {
    sVar1 = sqvector<SQLineInfo,_unsigned_int>::size
                      ((sqvector<SQLineInfo,_unsigned_int> *)(in_RDI + 0x140));
    if (sVar1 <= local_90) break;
    pSVar4 = sqvector<SQLineInfo,_unsigned_int>::operator[]
                       ((sqvector<SQLineInfo,_unsigned_int> *)(in_RDI + 0x140),(size_type)local_90);
    pSVar2->_lineinfos[local_90] = *pSVar4;
    local_90 = local_90 + 1;
  }
  local_98 = 0;
  while( true ) {
    uVar6 = local_98;
    sVar1 = sqvector<long,_unsigned_int>::size((sqvector<long,_unsigned_int> *)(in_RDI + 0x1a8));
    if (sVar1 <= uVar6) break;
    plVar5 = sqvector<long,_unsigned_int>::operator[]
                       ((sqvector<long,_unsigned_int> *)(in_RDI + 0x1a8),(size_type)local_98);
    pSVar2->_defaultparams[local_98] = *plVar5;
    local_98 = local_98 + 1;
  }
  __dest = pSVar2->_instructions;
  __src = sqvector<SQInstruction,_unsigned_int>::operator[]
                    ((sqvector<SQInstruction,_unsigned_int> *)(in_RDI + 200),0);
  sVar1 = sqvector<SQInstruction,_unsigned_int>::size
                    ((sqvector<SQInstruction,_unsigned_int> *)(in_RDI + 200));
  memcpy(__dest,__src,(ulong)sVar1 << 3);
  pSVar2->_varparams = (ulong)(*(byte *)(in_RDI + 0x48) & 1);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this_00);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this_00);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this_00);
  return pSVar2;
}

Assistant:

SQFunctionProto *SQFuncState::BuildProto()
{
    SQFunctionProto *f=SQFunctionProto::Create(_ss,lang_features,_instructions.size(),
        _nliterals,_parameters.size(),_functions.size(),_outervalues.size(),
        _lineinfos.size(),_localvarinfos.size(),_defaultparams.size());

    SQObjectPtr refidx,key,val;
    SQInteger idx;

    f->_stacksize = _stacksize;
    f->_sourcename = _sourcename;
    f->_bgenerator = _bgenerator;
    f->_name = _name;
    f->_hoistingLevel = _hoistLevel;

    while((idx=_table(_literals)->Next(false,refidx,key,val))!=-1) {
        f->_literals[_integer(val)]=key;
        refidx=idx;
    }

    for(SQUnsignedInteger nf = 0; nf < _functions.size(); nf++) f->_functions[nf] = _functions[nf];
    for(SQUnsignedInteger np = 0; np < _parameters.size(); np++) f->_parameters[np] = _parameters[np];
    for(SQUnsignedInteger no = 0; no < _outervalues.size(); no++) f->_outervalues[no] = _outervalues[no];
    for(SQUnsignedInteger nl = 0; nl < _localvarinfos.size(); nl++) f->_localvarinfos[nl] = _localvarinfos[nl];
    for(SQUnsignedInteger ni = 0; ni < _lineinfos.size(); ni++) f->_lineinfos[ni] = _lineinfos[ni];
    for(SQUnsignedInteger nd = 0; nd < _defaultparams.size(); nd++) f->_defaultparams[nd] = _defaultparams[nd];

    memcpy(f->_instructions,&_instructions[0],_instructions.size()*sizeof(SQInstruction));

    f->_varparams = _varparams;

    return f;
}